

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O1

ASN1_OBJECT *
create_object_with_text_oid(_func_int *get_nid,char *oid,char *short_name,char *long_name)

{
  int iVar1;
  size_t len_00;
  ASN1_OBJECT *pAVar2;
  uint8_t *buf;
  size_t len;
  CBB cbb;
  uchar *local_60;
  int local_58 [2];
  CBB local_50;
  
  iVar1 = CBB_init(&local_50,0x20);
  if (iVar1 != 0) {
    len_00 = strlen(oid);
    iVar1 = CBB_add_asn1_oid_from_text(&local_50,oid,len_00);
    if ((iVar1 != 0) && (iVar1 = CBB_finish(&local_50,&local_60,(size_t *)local_58), iVar1 != 0)) {
      if (get_nid == (_func_int *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = (*get_nid)();
      }
      pAVar2 = ASN1_OBJECT_create(iVar1,local_60,local_58[0],short_name,long_name);
      OPENSSL_free(local_60);
      return (ASN1_OBJECT *)pAVar2;
    }
  }
  ERR_put_error(8,0,0x65,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/obj/obj.cc"
                ,0x163);
  CBB_cleanup(&local_50);
  return (ASN1_OBJECT *)0x0;
}

Assistant:

static ASN1_OBJECT *create_object_with_text_oid(int (*get_nid)(void),
                                                const char *oid,
                                                const char *short_name,
                                                const char *long_name) {
  uint8_t *buf;
  size_t len;
  CBB cbb;
  if (!CBB_init(&cbb, 32) ||
      !CBB_add_asn1_oid_from_text(&cbb, oid, strlen(oid)) ||
      !CBB_finish(&cbb, &buf, &len)) {
    OPENSSL_PUT_ERROR(OBJ, OBJ_R_INVALID_OID_STRING);
    CBB_cleanup(&cbb);
    return NULL;
  }

  ASN1_OBJECT *ret = ASN1_OBJECT_create(get_nid ? get_nid() : NID_undef, buf,
                                        len, short_name, long_name);
  OPENSSL_free(buf);
  return ret;
}